

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void J400ToARGBRow_SSE2(uint8_t *src_y,uint8_t *dst_argb,int width)

{
  ulong uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [14];
  undefined1 auVar6 [12];
  unkbyte10 Var7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar17 [16];
  undefined1 auVar23 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 uVar21;
  undefined2 uVar22;
  
  do {
    uVar1 = *(ulong *)src_y;
    src_y = (uint8_t *)((long)src_y + 8);
    uVar21 = (undefined1)(uVar1 >> 0x38);
    auVar16._8_6_ = 0;
    auVar16._0_8_ = uVar1;
    auVar16[0xe] = uVar21;
    auVar16[0xf] = uVar21;
    uVar21 = (undefined1)(uVar1 >> 0x30);
    auVar15._14_2_ = auVar16._14_2_;
    auVar15._8_5_ = 0;
    auVar15._0_8_ = uVar1;
    auVar15[0xd] = uVar21;
    auVar14._13_3_ = auVar15._13_3_;
    auVar14._8_4_ = 0;
    auVar14._0_8_ = uVar1;
    auVar14[0xc] = uVar21;
    uVar21 = (undefined1)(uVar1 >> 0x28);
    auVar13._12_4_ = auVar14._12_4_;
    auVar13._8_3_ = 0;
    auVar13._0_8_ = uVar1;
    auVar13[0xb] = uVar21;
    auVar12._11_5_ = auVar13._11_5_;
    auVar12._8_2_ = 0;
    auVar12._0_8_ = uVar1;
    auVar12[10] = uVar21;
    uVar21 = (undefined1)(uVar1 >> 0x20);
    auVar11._10_6_ = auVar12._10_6_;
    auVar11[8] = 0;
    auVar11._0_8_ = uVar1;
    auVar11[9] = uVar21;
    auVar10._9_7_ = auVar11._9_7_;
    auVar10[8] = uVar21;
    auVar10._0_8_ = uVar1;
    uVar21 = (undefined1)(uVar1 >> 0x18);
    Var7 = CONCAT91(CONCAT81(auVar10._8_8_,uVar21),uVar21);
    uVar21 = (undefined1)(uVar1 >> 0x10);
    auVar6._2_10_ = Var7;
    auVar6[1] = uVar21;
    auVar6[0] = uVar21;
    uVar21 = (undefined1)(uVar1 >> 8);
    auVar5._2_12_ = auVar6;
    auVar5[1] = uVar21;
    auVar5[0] = uVar21;
    auVar9._0_2_ = CONCAT11((char)uVar1,(char)uVar1);
    auVar9._2_14_ = auVar5;
    uVar22 = (undefined2)Var7;
    auVar20._0_12_ = auVar9._0_12_;
    auVar20._12_2_ = uVar22;
    auVar20._14_2_ = uVar22;
    auVar19._12_4_ = auVar20._12_4_;
    auVar19._0_10_ = auVar9._0_10_;
    auVar19._10_2_ = auVar6._0_2_;
    auVar18._10_6_ = auVar19._10_6_;
    auVar18._0_8_ = auVar9._0_8_;
    auVar18._8_2_ = auVar6._0_2_;
    auVar17._8_8_ = auVar18._8_8_;
    auVar17._6_2_ = auVar5._0_2_;
    auVar17._4_2_ = auVar5._0_2_;
    auVar17._2_2_ = auVar9._0_2_;
    auVar17._0_2_ = auVar9._0_2_;
    auVar23._2_2_ = auVar10._8_2_;
    auVar23._0_2_ = auVar10._8_2_;
    auVar23._4_2_ = auVar12._10_2_;
    auVar23._6_2_ = auVar12._10_2_;
    auVar23._8_2_ = auVar14._12_2_;
    auVar23._10_2_ = auVar14._12_2_;
    auVar23._12_2_ = auVar15._14_2_;
    auVar23._14_2_ = auVar15._14_2_;
    auVar3[0xb] = 0xff;
    auVar3._0_11_ = ZEXT811(0xff000000ff000000);
    auVar3._12_3_ = 0;
    auVar3[0xf] = 0xff;
    auVar4[0xb] = 0xff;
    auVar4._0_11_ = ZEXT811(0xff000000ff000000);
    auVar4._12_3_ = 0;
    auVar4[0xf] = 0xff;
    *(undefined1 (*) [16])dst_argb = auVar17 | auVar3;
    *(undefined1 (*) [16])((long)dst_argb + 0x10) = auVar23 | auVar4;
    dst_argb = (uint8_t *)((long)dst_argb + 0x20);
    iVar8 = width + -8;
    bVar2 = 7 < width;
    width = iVar8;
  } while (iVar8 != 0 && bVar2);
  return;
}

Assistant:

void J400ToARGBRow_SSE2(const uint8_t* src_y, uint8_t* dst_argb, int width) {
  asm volatile(
      "pcmpeqb     %%xmm5,%%xmm5                 \n"
      "pslld       $0x18,%%xmm5                  \n"

      LABELALIGN
      "1:                                        \n"
      "movq        (%0),%%xmm0                   \n"
      "lea         0x8(%0),%0                    \n"
      "punpcklbw   %%xmm0,%%xmm0                 \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "punpcklwd   %%xmm0,%%xmm0                 \n"
      "punpckhwd   %%xmm1,%%xmm1                 \n"
      "por         %%xmm5,%%xmm0                 \n"
      "por         %%xmm5,%%xmm1                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "movdqu      %%xmm1,0x10(%1)               \n"
      "lea         0x20(%1),%1                   \n"
      "sub         $0x8,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src_y),     // %0
        "+r"(dst_argb),  // %1
        "+r"(width)      // %2
        ::"memory",
        "cc", "xmm0", "xmm1", "xmm5");
}